

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O3

char * zt_opt_get_value(int argn,int defn,char **argv,zt_opt_def_t *def,int *args_consumed,
                       zt_opt_error error)

{
  char *pcVar1;
  char *__s1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *__s2;
  char *pcVar5;
  
  pcVar1 = argv[argn];
  __s1 = def[defn].lopt;
  *args_consumed = 0;
  pcVar5 = pcVar1;
  do {
    __s2 = pcVar5;
    cVar2 = *__s2;
    pcVar5 = __s2 + 1;
    pcVar4 = pcVar5;
  } while (cVar2 == '-');
  while( true ) {
    if (cVar2 == '\0') {
      iVar3 = strcmp(__s1,__s2);
      if ((iVar3 == 0) || (*pcVar5 == '\0')) {
        pcVar5 = argv[(long)argn + 1];
        *args_consumed = 1;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = (char *)0x0;
          (*error)(0x16,"while processing arg \'%s\'",pcVar1);
        }
      }
      return pcVar5;
    }
    if (cVar2 == '=') break;
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  }
  return pcVar4;
}

Assistant:

char *
zt_opt_get_value(int argn, int defn, char ** argv, zt_opt_def_t * def, int *args_consumed, zt_opt_error error) {
    char * p      = argv[argn];
    char * pp     = NULL;
    char * result = NULL;
    char * lopt   = def[defn].lopt;

    *args_consumed = 0;

    /* skip past any leading '-' */
    while(*p == '-') { p++; }

    pp = p;
    do {
        if (*pp == '=') {
            result = ++pp;
            break;
        }
    } while (*pp++);

    if (!result) {
        pp = p;
        /* there was no '=' embedded
         * try matching the long opt name
         */
        if (strcmp(lopt, pp) == 0) {
            result = argv[argn + 1]; /* default to the next option */
            *args_consumed = 1;
        } else {
            /* short opt */
            pp++;
            if(*pp) {
                result = pp;
            } else {
                result = argv[argn + 1];
                *args_consumed = 1;
            }
        }
    }

    if (!result) {
        error(EINVAL, "while processing arg '%s'", argv[argn]);
    }

    return result;
}